

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::AdvancedPipelinePreVS::Run(AdvancedPipelinePreVS *this)

{
  CallLogWrapper *this_00;
  int width;
  RenderTarget *pRVar1;
  bool bVar2;
  GLuint GVar3;
  bool *compile_error;
  bool *compile_error_00;
  undefined8 *puVar4;
  undefined8 *puVar5;
  long lVar6;
  byte bVar7;
  float data [32];
  string local_c8;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98 [7];
  
  bVar7 = 0;
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,
             "\nlayout(local_size_x = 4) in;\nstruct Vertex {\n  vec4 position;\n  vec4 color;\n};\nlayout(binding = 0, std430) buffer VertexBuffer {\n  Vertex g_vertex[];\n};\nuniform float g_scale = 0.8;\nvoid main() {\n  g_vertex[gl_GlobalInvocationID.x].position.xyz *= g_scale;\n  g_vertex[gl_GlobalInvocationID.x].color *= vec4(0, 1, 0, 1);\n}"
             ,"");
  GVar3 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,(string *)local_a8)
  ;
  this->m_program[0] = GVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0]._M_allocated_capacity + 1);
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program[0]);
  bVar2 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program[0],compile_error);
  lVar6 = -1;
  if (bVar2) {
    local_a8._0_8_ = local_98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,
               "\nlayout(location = 0) in vec4 g_position;\nlayout(location = 1) in vec4 g_color;\nout StageData {\n  vec4 color;\n} g_vs_out;\nvoid main() {\n  gl_Position = g_position;\n  g_vs_out.color = g_color;\n}"
               ,"");
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,
               "\nin StageData {\n  vec4 color;\n} g_fs_in;\nlayout(location = 0) out vec4 g_color;\nvoid main() {\n  g_color = g_fs_in.color;\n}"
               ,"");
    GVar3 = ComputeShaderBase::CreateProgram
                      (&this->super_ComputeShaderBase,(string *)local_a8,&local_c8);
    this->m_program[1] = GVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ != local_98) {
      operator_delete((void *)local_a8._0_8_,local_98[0]._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program[1]);
    bVar2 = ComputeShaderBase::CheckProgram
                      (&this->super_ComputeShaderBase,this->m_program[1],compile_error_00);
    if (bVar2) {
      puVar4 = &DAT_01a703c0;
      puVar5 = (undefined8 *)local_a8;
      for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      }
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_vertex_buffer);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x8892,0x80,local_a8,0x88e4);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
      glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
      glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x20,(void *)0x0);
      glu::CallLogWrapper::glVertexAttribPointer(this_00,1,4,0x1406,'\0',0x20,(void *)0x10);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
      glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
      glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
      glu::CallLogWrapper::glBindVertexArray(this_00,0);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_vertex_buffer);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program[0]);
      glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
      glu::CallLogWrapper::glClear(this_00,0x4000);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program[1]);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      glu::CallLogWrapper::glMemoryBarrier(this_00,1);
      glu::CallLogWrapper::glDrawArraysInstanced(this_00,5,0,4,1);
      pRVar1 = (this->super_ComputeShaderBase).renderTarget;
      width = pRVar1->m_width;
      if (width < 500) {
        local_a8._0_8_ = (pointer)0x3f80000000000000;
        local_a8._8_4_ = 0.0;
        bVar2 = ComputeShaderBase::ValidateReadBufferCenteredQuad
                          (&this->super_ComputeShaderBase,width,pRVar1->m_height,(vec3 *)local_a8);
        if (!bVar2) {
          return -1;
        }
      }
      lVar6 = 0;
    }
  }
  return lVar6;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 4) in;" NL "struct Vertex {" NL "  vec4 position;" NL "  vec4 color;" NL "};" NL
			   "layout(binding = 0, std430) buffer VertexBuffer {" NL "  Vertex g_vertex[];" NL "};" NL
			   "uniform float g_scale = 0.8;" NL "void main() {" NL
			   "  g_vertex[gl_GlobalInvocationID.x].position.xyz *= g_scale;" NL
			   "  g_vertex[gl_GlobalInvocationID.x].color *= vec4(0, 1, 0, 1);" NL "}";
		m_program[0] = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program[0]);
		if (!CheckProgram(m_program[0]))
			return ERROR;

		const char* const glsl_vs =
			NL "layout(location = 0) in vec4 g_position;" NL "layout(location = 1) in vec4 g_color;" NL
			   "out StageData {" NL "  vec4 color;" NL "} g_vs_out;" NL "void main() {" NL
			   "  gl_Position = g_position;" NL "  g_vs_out.color = g_color;" NL "}";

		const char* const glsl_fs =
			NL "in StageData {" NL "  vec4 color;" NL "} g_fs_in;" NL "layout(location = 0) out vec4 g_color;" NL
			   "void main() {" NL "  g_color = g_fs_in.color;" NL "}";
		m_program[1] = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program[1]);
		if (!CheckProgram(m_program[1]))
			return ERROR;

		/* vertex buffer */
		{
			const float data[] = { -1, -1, 0, 1, 1, 1, 1, 1, 1, -1, 0, 1, 1, 1, 1, 1,
								   -1, 1,  0, 1, 1, 1, 1, 1, 1, 1,  0, 1, 1, 1, 1, 1 };
			glGenBuffers(1, &m_vertex_buffer);
			glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, 2 * sizeof(vec4), 0);
		glVertexAttribPointer(1, 4, GL_FLOAT, GL_FALSE, 2 * sizeof(vec4), reinterpret_cast<void*>(sizeof(vec4)));
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glBindVertexArray(0);

		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_vertex_buffer);
		glUseProgram(m_program[0]);
		glDispatchCompute(1, 1, 1);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program[1]);
		glBindVertexArray(m_vertex_array);
		glMemoryBarrier(GL_VERTEX_ATTRIB_ARRAY_BARRIER_BIT);
		glDrawArraysInstanced(GL_TRIANGLE_STRIP, 0, 4, 1);

		if (getWindowWidth() < 500 &&
			!ValidateReadBufferCenteredQuad(getWindowWidth(), getWindowHeight(), vec3(0, 1, 0)))
		{
			return ERROR;
		}
		return NO_ERROR;
	}